

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadSource(ColladaParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator local_71;
  string local_70;
  allocator local_39;
  undefined1 local_38 [8];
  string sourceID;
  int indexID;
  ColladaParser *this_local;
  
  sourceID.field_2._12_4_ = GetAttribute(this,"id");
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[6])
                    (this->mReader,(ulong)(uint)sourceID.field_2._12_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,(char *)CONCAT44(extraout_var,iVar2),&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  while (uVar3 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (uVar3 & 1) != 0) {
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar2 == 1) {
      bVar1 = IsElement(this,"float_array");
      if (((bVar1) || (bVar1 = IsElement(this,"IDREF_array"), bVar1)) ||
         (bVar1 = IsElement(this,"Name_array"), bVar1)) {
        ReadDataArray(this);
      }
      else {
        bVar1 = IsElement(this,"technique_common");
        if (!bVar1) {
          bVar1 = IsElement(this,"accessor");
          if (bVar1) {
            ReadAccessor(this,(string *)local_38);
          }
          else {
            SkipElement(this);
          }
        }
      }
    }
    else {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"source");
        if (iVar2 == 0) break;
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"technique_common");
        if (iVar2 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_70,"Expected end of <source> element.",&local_71);
          ThrowException(this,&local_70);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ColladaParser::ReadSource()
{
    int indexID = GetAttribute("id");
    std::string sourceID = mReader->getAttributeValue(indexID);

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("float_array") || IsElement("IDREF_array") || IsElement("Name_array"))
            {
                ReadDataArray();
            }
            else if (IsElement("technique_common"))
            {
                // I don't care for your profiles
            }
            else if (IsElement("accessor"))
            {
                ReadAccessor(sourceID);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "source") == 0)
            {
                // end of <source> - we're done
                break;
            }
            else if (strcmp(mReader->getNodeName(), "technique_common") == 0)
            {
                // end of another meaningless element - read over it
            }
            else
            {
                // everything else should be punished
                ThrowException("Expected end of <source> element.");
            }
        }
    }
}